

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O2

int pcap_set_tstamp_precision(pcap_t *p,int tstamp_precision)

{
  u_int *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (p->activated != 0) {
    builtin_strncpy(p->errbuf,"can\'t perform  operation on activated capture",0x2e);
    return -4;
  }
  if (tstamp_precision < 0) {
    return -0xc;
  }
  uVar2 = p->tstamp_precision_count;
  if (uVar2 == 0) {
    if (tstamp_precision != 0) {
      return -0xc;
    }
    (p->opt).tstamp_precision = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    do {
      if (uVar3 == uVar4) {
        return -0xc;
      }
      puVar1 = p->tstamp_precision_list + uVar4;
      uVar4 = uVar4 + 1;
    } while (*puVar1 != tstamp_precision);
    (p->opt).tstamp_precision = tstamp_precision;
  }
  return 0;
}

Assistant:

int
pcap_set_tstamp_precision(pcap_t *p, int tstamp_precision)
{
	int i;

	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);

	/*
	 * The argument should have been u_int, but that's too late
	 * to change now - it's an API.
	 */
	if (tstamp_precision < 0)
		return (PCAP_ERROR_TSTAMP_PRECISION_NOTSUP);

	/*
	 * If p->tstamp_precision_count is 0, we only support setting
	 * the time stamp precision to microsecond precision; every
	 * pcap module *MUST* support microsecond precision, even if
	 * it does so by converting the native precision to
	 * microseconds.
	 */
	if (p->tstamp_precision_count == 0) {
		if (tstamp_precision == PCAP_TSTAMP_PRECISION_MICRO) {
			p->opt.tstamp_precision = tstamp_precision;
			return (0);
		}
	} else {
		/*
		 * Check whether we claim to support this precision of
		 * time stamp.
		 */
		for (i = 0; i < p->tstamp_precision_count; i++) {
			if (p->tstamp_precision_list[i] == (u_int)tstamp_precision) {
				/*
				 * Yes.
				 */
				p->opt.tstamp_precision = tstamp_precision;
				return (0);
			}
		}
	}

	/*
	 * We don't support this time stamp precision.
	 */
	return (PCAP_ERROR_TSTAMP_PRECISION_NOTSUP);
}